

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O3

int libssh2_userauth_keyboard_interactive_ex
              (LIBSSH2_SESSION *session,char *user,uint user_len,
              _func_void_char_ptr_int_char_ptr_int_int_LIBSSH2_USERAUTH_KBDINT_PROMPT_ptr_LIBSSH2_USERAUTH_KBDINT_RESPONSE_ptr_void_ptr_ptr
              *response_callback)

{
  int iVar1;
  uchar *puVar2;
  LIBSSH2_USERAUTH_KBDINT_PROMPT *pLVar3;
  LIBSSH2_USERAUTH_KBDINT_PROMPT *pLVar4;
  size_t sVar5;
  char *pcVar6;
  LIBSSH2_USERAUTH_KBDINT_RESPONSE *pLVar7;
  ulong uVar8;
  long lVar9;
  uchar *local_70;
  LIBSSH2_USERAUTH_KBDINT_PROMPT **local_68;
  _func_void_char_ptr_int_char_ptr_int_int_LIBSSH2_USERAUTH_KBDINT_PROMPT_ptr_LIBSSH2_USERAUTH_KBDINT_RESPONSE_ptr_void_ptr_ptr
  *local_60;
  ulong local_58;
  char *local_50;
  size_t local_48;
  packet_requirev_state_t *local_40;
  time_t local_38;
  
  local_60 = response_callback;
  local_50 = user;
  local_38 = time((time_t *)0x0);
  local_68 = &session->userauth_kybd_prompts;
  local_48 = (size_t)(user_len + 0x37);
  local_40 = &session->userauth_kybd_packet_requirev_state;
  local_58 = (ulong)user_len;
LAB_0011dbc2:
  switch(session->userauth_kybd_state) {
  case libssh2_NB_state_idle:
    session->userauth_kybd_auth_name = (uchar *)0x0;
    session->userauth_kybd_auth_instruction = (uchar *)0x0;
    session->userauth_kybd_num_prompts = 0;
    session->userauth_kybd_auth_failure = 1;
    ((packet_requirev_state_t *)(local_68 + 2))->start = 0;
    *local_68 = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
    local_68[1] = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
    session->userauth_kybd_packet_len = local_48;
    puVar2 = (uchar *)(*session->alloc)(local_48,&session->abstract);
    session->userauth_kybd_data = puVar2;
    if (puVar2 != (uchar *)0x0) {
      local_70 = puVar2 + 1;
      *puVar2 = '2';
      _libssh2_store_str(&local_70,local_50,local_58);
      _libssh2_store_str(&local_70,"ssh-connection",0xe);
      _libssh2_store_str(&local_70,"keyboard-interactive",0x14);
      _libssh2_store_u32(&local_70,0);
      _libssh2_store_u32(&local_70,0);
      session->userauth_kybd_state = libssh2_NB_state_created;
      goto switchD_0011dbe0_caseD_2;
    }
    iVar1 = -6;
    pcVar6 = "Unable to allocate memory for keyboard-interactive authentication";
    break;
  default:
    goto switchD_0011dbe0_caseD_1;
  case libssh2_NB_state_created:
switchD_0011dbe0_caseD_2:
    iVar1 = _libssh2_transport_send
                      (session,session->userauth_kybd_data,session->userauth_kybd_packet_len,
                       (uchar *)0x0,0);
    if (iVar1 == 0) {
      (*session->free)(session->userauth_kybd_data,&session->abstract);
      session->userauth_kybd_data = (uchar *)0x0;
      do {
        session->userauth_kybd_state = libssh2_NB_state_sent;
switchD_0011dbe0_caseD_3:
        iVar1 = _libssh2_packet_requirev
                          (session,"43<",&session->userauth_kybd_data,
                           &session->userauth_kybd_data_len,0,(uchar *)0x0,0,local_40);
        if (iVar1 != 0) {
          if (iVar1 == -0x25) goto LAB_0011e013;
LAB_0011e024:
          session->userauth_kybd_state = libssh2_NB_state_idle;
          iVar1 = -0x12;
          pcVar6 = "Waiting for keyboard USERAUTH response";
          goto LAB_0011e03d;
        }
        if (session->userauth_kybd_data_len == 0) goto LAB_0011e024;
        puVar2 = session->userauth_kybd_data;
        if (*puVar2 == '3') goto LAB_0011e093;
        if (*puVar2 == '4') {
          (*session->free)(puVar2,&session->abstract);
          session->userauth_kybd_data = (uchar *)0x0;
          *(byte *)&session->state = (byte)session->state | 8;
          iVar1 = 0;
          goto LAB_0011e0df;
        }
        iVar1 = userauth_keyboard_interactive_decode_info_request(session);
        if (-1 < iVar1) {
          (*local_60)((char *)session->userauth_kybd_auth_name,
                      (int)session->userauth_kybd_auth_name_len,
                      (char *)session->userauth_kybd_auth_instruction,
                      (int)session->userauth_kybd_auth_instruction_len,
                      session->userauth_kybd_num_prompts,session->userauth_kybd_prompts,
                      session->userauth_kybd_responses,&session->abstract);
          session->userauth_kybd_packet_len = 5;
          if ((ulong)session->userauth_kybd_num_prompts != 0) {
            sVar5 = 5;
            lVar9 = 0;
            do {
              uVar8 = (ulong)*(uint *)((long)&session->userauth_kybd_responses->length + lVar9);
              if (-sVar5 - 5 < uVar8) goto LAB_0011e0c2;
              sVar5 = sVar5 + uVar8 + 4;
              session->userauth_kybd_packet_len = sVar5;
              lVar9 = lVar9 + 0x10;
            } while ((ulong)session->userauth_kybd_num_prompts << 4 != lVar9);
          }
          (*session->free)(session->userauth_kybd_data,&session->abstract);
          local_70 = (uchar *)(*session->alloc)(session->userauth_kybd_packet_len,&session->abstract
                                               );
          session->userauth_kybd_data = local_70;
          if (local_70 == (uchar *)0x0) {
LAB_0011e0c2:
            iVar1 = -6;
            pcVar6 = "Unable to allocate memory for keyboard-interactive response packet";
          }
          else {
            *local_70 = '=';
            local_70 = local_70 + 1;
            _libssh2_store_u32(&local_70,session->userauth_kybd_num_prompts);
            if (session->userauth_kybd_num_prompts != 0) {
              lVar9 = 8;
              uVar8 = 0;
              do {
                _libssh2_store_str(&local_70,
                                   *(char **)((long)session->userauth_kybd_responses + lVar9 + -8),
                                   (ulong)*(uint *)((long)&session->userauth_kybd_responses->text +
                                                   lVar9));
                uVar8 = uVar8 + 1;
                lVar9 = lVar9 + 0x10;
              } while (uVar8 < session->userauth_kybd_num_prompts);
            }
            session->userauth_kybd_state = libssh2_NB_state_sent1;
switchD_0011dbe0_caseD_4:
            iVar1 = _libssh2_transport_send
                              (session,session->userauth_kybd_data,session->userauth_kybd_packet_len
                               ,(uchar *)0x0,0);
            if (iVar1 == 0) {
              session->userauth_kybd_auth_failure = 0;
              goto switchD_0011dbe0_caseD_1;
            }
            if (iVar1 == -0x25) goto LAB_0011e013;
            iVar1 = -7;
            pcVar6 = "Unable to send userauth-keyboard-interactive request";
          }
          _libssh2_error(session,iVar1,pcVar6);
        }
switchD_0011dbe0_caseD_1:
        (*session->free)(session->userauth_kybd_data,&session->abstract);
        session->userauth_kybd_data = (uchar *)0x0;
        pLVar3 = session->userauth_kybd_prompts;
        pLVar4 = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
        if ((pLVar3 != (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0) &&
           (pLVar4 = pLVar3, session->userauth_kybd_num_prompts != 0)) {
          lVar9 = 0;
          uVar8 = 0;
          do {
            (*session->free)(*(void **)((long)&pLVar3->text + lVar9),&session->abstract);
            pLVar3 = session->userauth_kybd_prompts;
            *(undefined8 *)((long)&pLVar3->text + lVar9) = 0;
            uVar8 = uVar8 + 1;
            lVar9 = lVar9 + 0x18;
            pLVar4 = pLVar3;
          } while (uVar8 < session->userauth_kybd_num_prompts);
        }
        pLVar7 = session->userauth_kybd_responses;
        if (pLVar7 == (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0) {
          pLVar7 = (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0;
        }
        else if (session->userauth_kybd_num_prompts != 0) {
          lVar9 = 0;
          uVar8 = 0;
          do {
            (*session->free)(*(void **)((long)&pLVar7->text + lVar9),&session->abstract);
            pLVar7 = session->userauth_kybd_responses;
            *(undefined8 *)((long)&pLVar7->text + lVar9) = 0;
            uVar8 = uVar8 + 1;
            lVar9 = lVar9 + 0x10;
          } while (uVar8 < session->userauth_kybd_num_prompts);
          pLVar4 = *local_68;
        }
        if (pLVar4 != (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0) {
          (*session->free)(pLVar4,&session->abstract);
          session->userauth_kybd_prompts = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
          pLVar7 = session->userauth_kybd_responses;
        }
        if (pLVar7 != (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0) {
          (*session->free)(pLVar7,&session->abstract);
          session->userauth_kybd_responses = (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0;
        }
        if (session->userauth_kybd_auth_name != (uchar *)0x0) {
          (*session->free)(session->userauth_kybd_auth_name,&session->abstract);
          session->userauth_kybd_auth_name = (uchar *)0x0;
        }
        if (session->userauth_kybd_auth_instruction != (uchar *)0x0) {
          (*session->free)(session->userauth_kybd_auth_instruction,&session->abstract);
          session->userauth_kybd_auth_instruction = (uchar *)0x0;
        }
        if (session->userauth_kybd_auth_failure != 0) {
          iVar1 = -1;
LAB_0011e0df:
          session->userauth_kybd_state = libssh2_NB_state_idle;
          return iVar1;
        }
      } while( true );
    }
    if (iVar1 == -0x25) {
LAB_0011e013:
      iVar1 = -0x25;
      pcVar6 = "Would block";
    }
    else {
      (*session->free)(session->userauth_kybd_data,&session->abstract);
      session->userauth_kybd_data = (uchar *)0x0;
      session->userauth_kybd_state = libssh2_NB_state_idle;
      iVar1 = -7;
      pcVar6 = "Unable to send keyboard-interactive request";
    }
    break;
  case libssh2_NB_state_sent:
    goto switchD_0011dbe0_caseD_3;
  case libssh2_NB_state_sent1:
    goto switchD_0011dbe0_caseD_4;
  }
  goto LAB_0011e03d;
LAB_0011e093:
  (*session->free)(puVar2,&session->abstract);
  session->userauth_kybd_data = (uchar *)0x0;
  session->userauth_kybd_state = libssh2_NB_state_idle;
  iVar1 = -0x12;
  pcVar6 = "Authentication failed (keyboard-interactive)";
LAB_0011e03d:
  iVar1 = _libssh2_error(session,iVar1,pcVar6);
  if (iVar1 != -0x25) {
    return iVar1;
  }
  if (session->api_block_mode == 0) {
    return -0x25;
  }
  iVar1 = _libssh2_wait_socket(session,local_38);
  if (iVar1 != 0) {
    return iVar1;
  }
  goto LAB_0011dbc2;
}

Assistant:

LIBSSH2_API int
libssh2_userauth_keyboard_interactive_ex(LIBSSH2_SESSION *session,
                                         const char *user,
                                         unsigned int user_len,
                                         LIBSSH2_USERAUTH_KBDINT_RESPONSE_FUNC
                                             ((*response_callback)))
{
    int rc;
    BLOCK_ADJUST(rc, session,
                 userauth_keyboard_interactive(session, user, user_len,
                                               response_callback));
    return rc;
}